

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

Attachment __thiscall QCss::Declaration::attachmentValue(Declaration *this)

{
  DeclarationData *pDVar1;
  Attachment AVar2;
  quint64 qVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar1->parsed).d.field_0x18 < 4) {
    AVar2 = Attachment_Unknown;
    if ((pDVar1->values).d.size == 1) {
      ::QVariant::toString();
      qVar3 = findKnownValue((QString *)&local_40,attachments,3);
      AVar2 = (Attachment)qVar3;
      if ((QArrayData *)local_40.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_40.shared = *(int *)local_40.shared + -1;
        UNLOCK();
        if (*(int *)local_40.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_40.shared,2,0x10);
        }
      }
      ::QVariant::QVariant((QVariant *)&local_40,AVar2);
      ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_40);
      ::QVariant::~QVariant((QVariant *)&local_40);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return AVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    AVar2 = ::QVariant::toInt((bool *)&pDVar1->parsed);
    return AVar2;
  }
  __stack_chk_fail();
}

Assistant:

Attachment Declaration::attachmentValue() const
{
    if (d->parsed.isValid())
        return static_cast<Attachment>(d->parsed.toInt());
    if (d->values.size() != 1)
        return Attachment_Unknown;
    int v = findKnownValue(d->values.at(0).variant.toString(),
                           attachments, NumKnownAttachments);
    d->parsed = v;
    return static_cast<Attachment>(v);
}